

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O0

uint64_t CompressAmount(uint64_t n)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong in_RDI;
  long in_FS_OFFSET;
  int d;
  int e;
  int local_1c;
  ulong local_18;
  uint64_t local_10;
  
  if (in_RDI == 0) {
    local_10 = 0;
  }
  else {
    local_1c = 0;
    for (local_18 = in_RDI; local_18 % 10 == 0 && local_1c < 9; local_18 = local_18 / 10) {
      local_1c = local_1c + 1;
    }
    if (local_1c < 9) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_18;
      uVar2 = SUB164(auVar1 % ZEXT816(10),0);
      if (uVar2 == 0 || 9 < uVar2) {
        __assert_fail("d >= 1 && d <= 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/compressor.cpp"
                      ,0xa0,"uint64_t CompressAmount(uint64_t)");
      }
      local_10 = ((local_18 / 10) * 9 + (long)(int)uVar2 + -1) * 10 + 1 + (long)local_1c;
    }
    else {
      local_10 = (local_18 - 1) * 10 + 10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t CompressAmount(uint64_t n)
{
    if (n == 0)
        return 0;
    int e = 0;
    while (((n % 10) == 0) && e < 9) {
        n /= 10;
        e++;
    }
    if (e < 9) {
        int d = (n % 10);
        assert(d >= 1 && d <= 9);
        n /= 10;
        return 1 + (n*9 + d - 1)*10 + e;
    } else {
        return 1 + (n - 1)*10 + 9;
    }
}